

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationMultiQueueTests.cpp
# Opt level: O2

void vkt::synchronization::anon_unknown_2::createBarrierMultiQueue
               (DeviceInterface *vk,VkCommandBuffer *cmdBuffer,SyncInfo *writeSync,
               SyncInfo *readSync,Resource *resource,deUint32 writeFamily,deUint32 readFamily,
               VkSharingMode sharingMode,bool secondQueue)

{
  ResourceType type;
  undefined4 uVar1;
  VkImageSubresourceRange subresourceRange;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  VkImageMemoryBarrier barrier;
  VkImageMemoryBarrier local_78;
  
  type = resource->m_type;
  if (type != RESOURCE_TYPE_BUFFER) {
    if (type == RESOURCE_TYPE_IMAGE) {
      uVar1 = (resource->m_imageData).subresourceRange.baseArrayLayer;
      uVar2 = (resource->m_imageData).subresourceRange.aspectMask;
      uVar3 = (resource->m_imageData).subresourceRange.baseMipLevel;
      uVar4 = (resource->m_imageData).subresourceRange.levelCount;
      subresourceRange.levelCount = uVar4;
      subresourceRange.baseMipLevel = uVar3;
      subresourceRange.aspectMask = uVar2;
      subresourceRange.baseArrayLayer = uVar1;
      subresourceRange.layerCount = (resource->m_imageData).subresourceRange.layerCount;
      makeImageMemoryBarrier
                (&local_78,writeSync->accessMask,readSync->accessMask,writeSync->imageLayout,
                 readSync->imageLayout,(VkImage)(resource->m_imageData).handle.m_internal,
                 subresourceRange);
      if (sharingMode == VK_SHARING_MODE_EXCLUSIVE && writeFamily != readFamily) {
        local_78.dstQueueFamilyIndex = readFamily;
        local_78.srcQueueFamilyIndex = writeFamily;
        if (secondQueue) {
          local_78.oldLayout = local_78.newLayout;
          local_78.srcAccessMask = local_78.dstAccessMask;
        }
      }
      else if (secondQueue) {
        return;
      }
      (*vk->_vptr_DeviceInterface[0x6d])
                (vk,*cmdBuffer,(ulong)writeSync->stageMask,(ulong)readSync->stageMask,0,0,0,0,0,1,
                 &local_78);
      return;
    }
    bVar5 = isIndirectBuffer(type);
    if (!bVar5) {
      return;
    }
  }
  if (sharingMode == VK_SHARING_MODE_EXCLUSIVE && writeFamily != readFamily) {
    local_78.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
    local_78.pNext = (void *)0x0;
    local_78.srcAccessMask = writeSync->accessMask;
    local_78.dstAccessMask = readSync->accessMask;
    local_78.newLayout = readFamily;
    local_78.srcQueueFamilyIndex = (deUint32)(resource->m_bufferData).handle.m_internal;
    local_78.dstQueueFamilyIndex =
         *(deUint32 *)((long)&(resource->m_bufferData).handle.m_internal + 4);
    local_78.image.m_internal._0_4_ = (undefined4)(resource->m_bufferData).offset;
    local_78.image.m_internal._4_4_ = *(undefined4 *)((long)&(resource->m_bufferData).offset + 4);
    local_78.subresourceRange._0_8_ = (resource->m_bufferData).size;
    local_78.oldLayout = writeFamily;
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,*cmdBuffer,(ulong)writeSync->stageMask,(ulong)readSync->stageMask,0,0,0,1,
               (int)&local_78,0,0);
  }
  return;
}

Assistant:

void createBarrierMultiQueue (const DeviceInterface&	vk,
							  const VkCommandBuffer&	cmdBuffer,
							  const SyncInfo&			writeSync,
							  const SyncInfo&			readSync,
							  const Resource&			resource,
							  const deUint32			writeFamily,
							  const deUint32			readFamily,
							  const VkSharingMode		sharingMode,
							  const bool				secondQueue = false)
{
	if (resource.getType() == RESOURCE_TYPE_IMAGE)
	{
		VkImageMemoryBarrier barrier = makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
			writeSync.imageLayout, readSync.imageLayout, resource.getImage().handle, resource.getImage().subresourceRange);

		if (writeFamily != readFamily && VK_SHARING_MODE_EXCLUSIVE == sharingMode)
		{
			barrier.srcQueueFamilyIndex = writeFamily;
			barrier.dstQueueFamilyIndex = readFamily;
			if (secondQueue)
			{
				barrier.oldLayout		= barrier.newLayout;
				barrier.srcAccessMask	= barrier.dstAccessMask;
			}
			vk.cmdPipelineBarrier(cmdBuffer, writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}
		else if (!secondQueue)
			vk.cmdPipelineBarrier(cmdBuffer, writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
	}
	else if ((resource.getType() == RESOURCE_TYPE_BUFFER || isIndirectBuffer(resource.getType()))	&&
			 writeFamily != readFamily																&&
			 VK_SHARING_MODE_EXCLUSIVE == sharingMode)
	{
		const VkBufferMemoryBarrier barrier =
		{
			VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
			DE_NULL,									// const void*		pNext;
			writeSync.accessMask ,						// VkAccessFlags	srcAccessMask;
			readSync.accessMask,						// VkAccessFlags	dstAccessMask;
			writeFamily,								// deUint32			srcQueueFamilyIndex;
			readFamily,									// deUint32			destQueueFamilyIndex;
			resource.getBuffer().handle,				// VkBuffer			buffer;
			resource.getBuffer().offset,				// VkDeviceSize		offset;
			resource.getBuffer().size,					// VkDeviceSize		size;
		};
		vk.cmdPipelineBarrier(cmdBuffer, writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, (const VkBufferMemoryBarrier*)&barrier, 0u, (const VkImageMemoryBarrier *)DE_NULL);
	}
}